

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O3

void accum_global_gauden_full
               (vector_t ****acc,vector_t ****l_acc,gauden_t *g,uint32 *lcl2glb,uint32 n_lcl2glb)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  vector_t *ppfVar4;
  vector_t *ppfVar5;
  vector_t pfVar6;
  vector_t pfVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (n_lcl2glb != 0 && acc != (vector_t ****)0x0) {
    uVar1 = g->n_feat;
    uVar2 = g->n_density;
    uVar11 = 0;
    do {
      if ((ulong)uVar1 != 0) {
        uVar3 = lcl2glb[uVar11];
        uVar9 = 0;
        do {
          if ((ulong)uVar2 != 0) {
            uVar12 = (ulong)g->veclen[uVar9];
            uVar13 = 0;
            do {
              if (uVar12 != 0) {
                ppfVar4 = l_acc[uVar11][uVar9][uVar13];
                ppfVar5 = acc[uVar3][uVar9][uVar13];
                uVar10 = 0;
                do {
                  pfVar6 = ppfVar4[uVar10];
                  pfVar7 = ppfVar5[uVar10];
                  uVar8 = 0;
                  do {
                    pfVar7[uVar8] = pfVar6[uVar8] + pfVar7[uVar8];
                    uVar8 = uVar8 + 1;
                  } while (uVar12 != uVar8);
                  uVar10 = uVar10 + 1;
                } while (uVar10 != uVar12);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar2);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar1);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != n_lcl2glb);
  }
  return;
}

Assistant:

void
accum_global_gauden_full(vector_t ****acc,
			 vector_t ****l_acc,
			 gauden_t *g,
			 uint32 *lcl2glb,
			 uint32 n_lcl2glb)
{
    uint32 n_feat;
    uint32 n_density;
    uint32 ii, i, j, k, l, ll;

    if (acc == NULL) {
	/* nothing to do */

	return;
    }

    n_feat = gauden_n_feat(g);
    n_density = gauden_n_density(g);

    /* for each mixture density */
    for (ii = 0; ii < n_lcl2glb; ii++) {
	/* map local density id to global one */
	i = lcl2glb[ii];

	/* for each feature */
	for (j = 0; j < n_feat; j++) {

	    /* for each density in the mixture density */
	    for (k = 0; k < n_density; k++) {
		
		for (l = 0; l < g->veclen[j]; l++) {
		    for (ll = 0; ll < g->veclen[j]; ll++) {
			acc[i][j][k][l][ll] += l_acc[ii][j][k][l][ll];
		    }
		}
	    }
	}
    }
}